

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void linearize_local_statement(Proc *proc,AstNode *stmt)

{
  LuaSymbolList *head;
  PtrList *pPVar1;
  AstNodeList *expr_list;
  long lVar2;
  undefined8 proc_00;
  int nv;
  void *pvVar3;
  PtrListIterator *pPVar4;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  PtrListIterator symiter__;
  
  uStack_60 = 0x117267;
  symiter__._16_8_ = proc;
  nv = raviX_ptrlist_size((PtrList *)(stmt->field_2).local_stmt.var_list);
  lVar2 = (long)nv * -0x10;
  head = (stmt->field_2).local_stmt.var_list;
  *(undefined8 *)(local_58 + lVar2 + -8) = 0x11728d;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_58,(PtrList *)head);
  pPVar4 = (PtrListIterator *)((long)&symiter__ + (long)nv * -0x10);
  while( true ) {
    *(undefined8 *)(local_58 + lVar2 + -8) = 0x11729d;
    pvVar3 = raviX_ptrlist_iter_next((PtrListIterator *)local_58);
    proc_00 = symiter__._16_8_;
    if (pvVar3 == (void *)0x0) {
      expr_list = (stmt->field_2).local_stmt.expr_list;
      *(undefined8 *)(local_58 + lVar2 + -8) = 0x1172cf;
      linearize_assignment((Proc *)proc_00,expr_list,(node_info *)(local_58 + lVar2),nv);
      return;
    }
    pPVar1 = *(PtrList **)((long)pvVar3 + 0x38);
    if (pPVar1 == (PtrList *)0x0) break;
    *(long *)&pPVar4[-1].__nr = (long)pvVar3 + 8;
    pPVar4->__head = pPVar1;
    pPVar4 = (PtrListIterator *)&pPVar4->__nr;
  }
  *(code **)(local_58 + lVar2 + -8) = linearize_expression_statement;
  __assert_fail("var_pseudo",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x79c,"void linearize_local_statement(Proc *, AstNode *)");
}

Assistant:

static void linearize_local_statement(Proc *proc, AstNode *stmt)
{
	LuaSymbol *sym;

	int nv = raviX_ptrlist_size((const PtrList *)stmt->local_stmt.var_list);
	struct node_info *varinfo = (struct node_info *)alloca(nv * sizeof(struct node_info));
	int i = 0;

	FOR_EACH_PTR(stmt->local_stmt.var_list, LuaSymbol, sym)
	{
		Pseudo *var_pseudo = sym->variable.pseudo;
		assert(var_pseudo);
		varinfo[i].vartype = &sym->variable.value_type;
		varinfo[i].pseudo = var_pseudo;
		i++;
	}
	END_FOR_EACH_PTR(var)

	linearize_assignment(proc, stmt->local_stmt.expr_list, varinfo, nv);
}